

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<unsigned_long>::test_random_numerators<(libdivide::Branching)0>
          (DivideTest<unsigned_long> *this,unsigned_long denom,
          divider<unsigned_long,_(libdivide::Branching)0> *the_divider)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong numer;
  long lVar5;
  
  lVar3 = 0;
  do {
    lVar5 = 8;
    do {
      uVar4 = this->seed * 0x19660d + 0x3c6ef35f;
      this->seed = uVar4;
      uVar2 = this->rand_n;
      uVar1 = ((uVar4 & 1) + 1) * uVar2 + 3 + uVar2 % 0x1c9c381;
      numer = (ulong)(uVar4 % 0x13);
      if (uVar2 <= uVar1) {
        numer = uVar1;
      }
      this->rand_n = numer;
      test_one<(libdivide::Branching)0>(this,numer,denom,the_divider);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10000);
  return;
}

Assistant:

void test_random_numerators(T denom, const divider<T, ALGO> &the_divider) {
        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                test_one(get_random(), denom, the_divider);
            }
        }
    }